

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::for_statement::~for_statement(for_statement *this)

{
  for_statement *this_local;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__for_statement_0029a6f8;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr(&this->s_);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->iter_)
  ;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->cond_)
  ;
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr(&this->init_);
  statement::~statement(&this->super_statement);
  return;
}

Assistant:

explicit for_statement(const source_extend& extend, statement_ptr&& init, expression_ptr&& cond, expression_ptr&& iter, statement_ptr&& s) : statement(extend), init_(std::move(init)), cond_(std::move(cond)), iter_(std::move(iter)), s_(std::move(s)) {
        assert(!init_ || init_->type() == statement_type::expression || init_->type() == statement_type::variable);
        assert(s_);
    }